

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O0

void __thiscall
chatra::Reader::parse
          (Reader *this,uint expectedVersion,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  fd_set *pfVar1;
  uint uVar2;
  IllegalArgumentException *this_00;
  fd_set *__writefds;
  unsigned_long __n;
  fd_set *__readfds;
  fd_set *in_R8;
  timeval *in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_true>,_bool>
  pVar3;
  allocator local_d1;
  string local_d0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_true>
  local_b0;
  undefined1 local_a8;
  allocator<unsigned_char> local_99;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  unsigned_long chunkSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> chunk;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes_local;
  uint expectedVersion_local;
  Reader *this_local;
  
  this->buffer = bytes;
  this->offset = 0;
  chunk.field_2._8_8_ = bytes;
  uVar2 = read<unsigned_int,_nullptr>(this);
  if (uVar2 == expectedVersion) {
    while (pfVar1 = (fd_set *)this->offset,
          __writefds = (fd_set *)
                       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                 (this->buffer), pfVar1 < __writefds) {
      read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&chunkSize,
                 this);
      __n = read<unsigned_long,_nullptr>(this);
      local_80._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin(this->buffer)
      ;
      local_78 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_80,this->offset);
      local_98._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin(this->buffer)
      ;
      local_90 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_98,this->offset);
      local_88 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_90,__n);
      std::allocator<unsigned_char>::allocator(&local_99);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_70,local_78,local_88,
                 &local_99);
      std::allocator<unsigned_char>::~allocator(&local_99);
      this->offset = this->offset + __n;
      pVar3 = std::
              unordered_map<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ::
              emplace<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((unordered_map<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                          *)&this->chunks,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &chunkSize,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      local_b0._M_cur =
           (__node_type *)
           pVar3.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_true>
           ._M_cur;
      local_a8 = pVar3.second;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      std::__cxx11::string::~string((string *)&chunkSize);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",&local_d1);
    select(this,(int)local_d0,__readfds,__writefds,in_R8,in_R9);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    return;
  }
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
  memset(this_00,0,0x28);
  IllegalArgumentException::IllegalArgumentException(this_00);
  __cxa_throw(this_00,&IllegalArgumentException::typeinfo,
              IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

void Reader::parse(unsigned expectedVersion, const std::vector<uint8_t>& bytes) {
	buffer = &bytes;
	offset = 0;

	if (read<unsigned>() != expectedVersion)
		throw IllegalArgumentException();

	while (offset < buffer->size()) {
		auto chunk = read<std::string>();
		auto chunkSize = read<size_t>();
		std::vector<uint8_t> data(buffer->cbegin() + offset, buffer->cbegin() + offset + chunkSize);
		offset += chunkSize;
		chunks.emplace(std::move(chunk), std::move(data));
	}

	select("");
}